

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O3

void Hacl_P256_raw_to_compressed(uint8_t *pk_raw,uint8_t *pk)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  *pk = pk_raw[0x3f] & 1 | 2;
  uVar1 = *(undefined8 *)(pk_raw + 8);
  uVar2 = *(undefined8 *)(pk_raw + 0x10);
  uVar3 = *(undefined8 *)(pk_raw + 0x18);
  *(undefined8 *)(pk + 1) = *(undefined8 *)pk_raw;
  *(undefined8 *)(pk + 9) = uVar1;
  *(undefined8 *)(pk + 0x11) = uVar2;
  *(undefined8 *)(pk + 0x19) = uVar3;
  return;
}

Assistant:

void Hacl_P256_raw_to_compressed(uint8_t *pk_raw, uint8_t *pk)
{
  uint8_t *pk_x = pk_raw;
  uint8_t *pk_y = pk_raw + 32U;
  uint64_t bn_f[4U] = { 0U };
  bn_from_bytes_be4(bn_f, pk_y);
  uint64_t is_odd_f = bn_f[0U] & 1ULL;
  pk[0U] = (uint32_t)(uint8_t)is_odd_f + 0x02U;
  memcpy(pk + 1U, pk_x, 32U * sizeof (uint8_t));
}